

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  uint *puVar3;
  char *in_RCX;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int family_00;
  int sock_04;
  int family_01;
  int sock_05;
  int sock_06;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  char *pcVar4;
  int in_ESI;
  undefined8 uVar5;
  char buf [3];
  nn_pollfd pfd [2];
  nn_thread thread;
  
  iVar1 = test_socket_impl((char *)0x83,in_ESI,in_EDX,(int)in_RCX);
  iVar2 = iVar1;
  test_bind_impl((char *)0x84,iVar1,sock,in_RCX);
  sc = test_socket_impl((char *)0x85,iVar2,family,(int)in_RCX);
  test_connect_impl((char *)0x86,sc,sock_00,in_RCX);
  test_send_impl((char *)0x87,sc,sock_01,in_RCX);
  nn_sleep(100);
  pfd[0].events = 3;
  pcVar4 = (char *)(ulong)(uint)sc;
  pfd[1].fd = sc;
  pfd[1].events = 3;
  pfd[0].fd = iVar1;
  iVar2 = nn_poll(pfd,2,0xffffffffffffffff);
  __stream = _stderr;
  if (iVar2 < 0) {
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            0x8e);
  }
  else {
    if (iVar2 == 2) {
      if (pfd[0].revents == 3) {
        if (pfd[1].revents == 2) {
          test_close_impl((char *)0x92,sc,sock_02);
          test_close_impl((char *)0x93,iVar1,sock_03);
          iVar1 = test_socket_impl((char *)0x96,iVar1,family_00,(int)pcVar4);
          iVar2 = iVar1;
          test_bind_impl((char *)0x97,iVar1,sock_04,pcVar4);
          sc = test_socket_impl((char *)0x98,iVar2,family_01,(int)pcVar4);
          test_connect_impl((char *)0x99,sc,sock_05,pcVar4);
          iVar2 = getevents(iVar1,3,1000);
          if (iVar2 == 2) {
            iVar2 = getevents(iVar1,1,10);
            if (iVar2 == 0) {
              test_send_impl((char *)0xa6,sc,sock_06,pcVar4);
              iVar2 = getevents(iVar1,1,1000);
              if (iVar2 == 1) {
                test_recv_impl((char *)0xab,iVar1,sock_07,pcVar4);
                iVar2 = getevents(iVar1,1,10);
                if (iVar2 == 0) {
                  nn_thread_init(&thread,routine1,(void *)0x0);
                  iVar2 = getevents(iVar1,1,1000);
                  if (iVar2 == 1) {
                    test_recv_impl((char *)0xb3,iVar1,sock_08,pcVar4);
                    nn_thread_term(&thread);
                    nn_thread_init(&thread,routine2,(void *)0x0);
                    iVar2 = getevents(iVar1,1,1000);
                    if (iVar2 == 1) {
                      iVar2 = nn_recv(iVar1,buf,3,0);
                      if (iVar2 < 0) {
                        iVar2 = nn_errno();
                        if (iVar2 == 0x9523dfd) {
                          nn_thread_term(&thread);
                          test_close_impl((char *)0xbf,sc,sock_09);
                          test_close_impl((char *)0xc0,iVar1,sock_10);
                          return 0;
                        }
                      }
                      pcVar4 = "rc < 0 && nn_errno () == ETERM";
                      uVar5 = 0xbb;
                    }
                    else {
                      pcVar4 = "rc == NN_IN";
                      uVar5 = 0xb9;
                    }
                  }
                  else {
                    pcVar4 = "rc == NN_IN";
                    uVar5 = 0xb2;
                  }
                }
                else {
                  pcVar4 = "rc == 0";
                  uVar5 = 0xad;
                }
              }
              else {
                pcVar4 = "rc == NN_IN";
                uVar5 = 0xa8;
              }
            }
            else {
              pcVar4 = "rc == 0";
              uVar5 = 0xa2;
            }
          }
          else {
            pcVar4 = "rc == NN_OUT";
            uVar5 = 0x9d;
          }
        }
        else {
          pcVar4 = "pfd [1].revents == NN_POLLOUT";
          uVar5 = 0x91;
        }
      }
      else {
        pcVar4 = "pfd [0].revents == (NN_POLLIN | NN_POLLOUT)";
        uVar5 = 0x90;
      }
    }
    else {
      pcVar4 = "rc == 2";
      uVar5 = 0x8f;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/poll.c",
            uVar5);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int sb;
    char buf [3];
    struct nn_thread thread;
    struct nn_pollfd pfd [2];

    /* Test nn_poll() function. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_send (sc, "ABC");
    nn_sleep (100);
    pfd [0].fd = sb;
    pfd [0].events = NN_POLLIN | NN_POLLOUT;
    pfd [1].fd = sc;
    pfd [1].events = NN_POLLIN | NN_POLLOUT;
    rc = nn_poll (pfd, 2, -1);
    errno_assert (rc >= 0);
    nn_assert (rc == 2);
    nn_assert (pfd [0].revents == (NN_POLLIN | NN_POLLOUT));
    nn_assert (pfd [1].revents == NN_POLLOUT);
    test_close (sc);
    test_close (sb);

    /*  Create a simple topology. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Check the initial state of the socket. */
    rc = getevents (sb, NN_IN | NN_OUT, 1000);
    nn_assert (rc == NN_OUT);

    /*  Poll for IN when there's no message available. The call should
        time out. */
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Send a message and start polling. This time IN event should be
        signaled. */
    test_send (sc, "ABC");
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);

    /*  Receive the message and make sure that IN is no longer signaled. */
    test_recv (sb, "ABC");
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Check signalling from a different thread. */
    nn_thread_init (&thread, routine1, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    test_recv (sb, "ABC");
    nn_thread_term (&thread);

    /*  Check terminating the library from a different thread. */
    nn_thread_init (&thread, routine2, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    nn_assert (rc < 0 && nn_errno () == ETERM);
    nn_thread_term (&thread);

    /*  Clean up. */
    test_close (sc);
    test_close (sb);

    return 0;
}